

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cesl_number_to_string.c
# Opt level: O3

size_t cesl_long_to_str(long value,char *dst_str,uint8_t base)

{
  long lVar1;
  long lVar2;
  char *pcVar3;
  size_t sVar4;
  size_t sVar5;
  char cVar6;
  undefined7 in_register_00000011;
  ulong uVar7;
  char cVar8;
  bool bVar9;
  char acStack_48 [72];
  
  bVar9 = (int)CONCAT71(in_register_00000011,base) != 10;
  lVar1 = -value;
  if (-1 < value || bVar9) {
    lVar1 = value;
  }
  uVar7 = CONCAT71(in_register_00000011,base) & 0xffffffff;
  sVar5 = 0;
  do {
    sVar4 = sVar5;
    lVar2 = lVar1 / (long)uVar7;
    cVar6 = (char)(lVar1 % (long)uVar7);
    cVar8 = 'W';
    if (cVar6 < '\n') {
      cVar8 = '0';
    }
    acStack_48[sVar4] = cVar8 + cVar6;
    sVar5 = sVar4 + 1;
    lVar1 = lVar2;
  } while (lVar2 != 0);
  if ((long)sVar5 < 1) {
    __assert_fail("(len > 0)&&(\"cesl_int64_to_str negative lenght\")",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/mlutken[P]nestle/cesl/cesl_strings/cesl_number_to_string.c"
                  ,0x20,"size_t cesl_int64_to_str(int64_t, char *, uint8_t)");
  }
  pcVar3 = acStack_48 + sVar4 + 1;
  if (-1 >= value && !bVar9) {
    *dst_str = '-';
    dst_str = dst_str + 1;
    sVar5 = sVar4 + 2;
  }
  for (; acStack_48 < pcVar3; pcVar3 = pcVar3 + -1) {
    *dst_str = pcVar3[-1];
    dst_str = dst_str + 1;
  }
  *dst_str = '\0';
  return sVar5;
}

Assistant:

size_t cesl_long_to_str(long value, char* dst_str, uint8_t base)
{
#if (LONG_MAX == INT64_MAX)
    return cesl_int64_to_str(value, dst_str, base);
#elif (LONG_MAX == INT32_MAX)
    return cesl_int32_to_str(value, dst_str, base);
#else
#error cesl_long_to_string__not_supported_on_this_platfform
#endif
}